

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImFont::BuildLookupTable(ImFont *this)

{
  ImVector<ImFont::Glyph> *this_00;
  ImVector<float> *this_01;
  ImVector<unsigned_short> *this_02;
  value_type vVar1;
  ushort uVar2;
  undefined2 uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  value_type *pvVar10;
  value_type *pvVar11;
  value_type_conflict *pvVar12;
  Glyph *pGVar13;
  uint uVar14;
  int i_1;
  int iVar15;
  int i;
  uint i_00;
  int i_2;
  float fVar16;
  
  this_00 = &this->Glyphs;
  uVar14 = 0;
  for (i_00 = 0; i_00 != this_00->Size; i_00 = i_00 + 1) {
    pvVar10 = ImVector<ImFont::Glyph>::operator[](this_00,i_00);
    if (uVar14 <= pvVar10->Codepoint) {
      uVar14 = (uint)pvVar10->Codepoint;
    }
  }
  if (i_00 < 0xffff) {
    this_01 = &this->IndexXAdvance;
    ImVector<float>::clear(this_01);
    this_02 = &this->IndexLookup;
    ImVector<unsigned_short>::clear(this_02);
    GrowIndex(this,uVar14 + 1);
    for (iVar15 = 0; iVar15 < this_00->Size; iVar15 = iVar15 + 1) {
      pvVar10 = ImVector<ImFont::Glyph>::operator[](this_00,iVar15);
      uVar2 = pvVar10->Codepoint;
      pvVar10 = ImVector<ImFont::Glyph>::operator[](this_00,iVar15);
      fVar16 = pvVar10->XAdvance;
      pvVar11 = ImVector<float>::operator[](this_01,(uint)uVar2);
      *pvVar11 = fVar16;
      pvVar12 = ImVector<unsigned_short>::operator[](this_02,(uint)uVar2);
      *pvVar12 = (value_type_conflict)iVar15;
    }
    pGVar13 = FindGlyph(this,0x20);
    if (pGVar13 != (Glyph *)0x0) {
      pvVar10 = ImVector<ImFont::Glyph>::back(this_00);
      if (pvVar10->Codepoint != 9) {
        ImVector<ImFont::Glyph>::resize(this_00,this_00->Size + 1);
      }
      pvVar10 = ImVector<ImFont::Glyph>::back(this_00);
      pGVar13 = FindGlyph(this,0x20);
      uVar3 = *(undefined2 *)&pGVar13->field_0x2;
      fVar16 = pGVar13->XAdvance;
      fVar4 = pGVar13->X0;
      fVar5 = pGVar13->Y0;
      fVar6 = pGVar13->X1;
      fVar7 = pGVar13->Y1;
      fVar8 = pGVar13->U0;
      fVar9 = pGVar13->V0;
      pvVar10->Codepoint = pGVar13->Codepoint;
      *(undefined2 *)&pvVar10->field_0x2 = uVar3;
      pvVar10->XAdvance = fVar16;
      pvVar10->X0 = fVar4;
      pvVar10->Y0 = fVar5;
      pvVar10->X1 = fVar6;
      pvVar10->Y1 = fVar7;
      pvVar10->U0 = fVar8;
      pvVar10->V0 = fVar9;
      fVar16 = pGVar13->V1;
      pvVar10->U1 = pGVar13->U1;
      pvVar10->V1 = fVar16;
      pvVar10->Codepoint = 9;
      fVar16 = pvVar10->XAdvance * 4.0;
      pvVar10->XAdvance = fVar16;
      pvVar11 = ImVector<float>::operator[](this_01,9);
      *pvVar11 = fVar16;
      iVar15 = (this->Glyphs).Size;
      pvVar12 = ImVector<unsigned_short>::operator[](this_02,(uint)pvVar10->Codepoint);
      *pvVar12 = (short)iVar15 - 1;
    }
    this->FallbackGlyph = (Glyph *)0x0;
    pGVar13 = FindGlyph(this,this->FallbackChar);
    this->FallbackGlyph = pGVar13;
    fVar16 = 0.0;
    if (pGVar13 != (Glyph *)0x0) {
      fVar16 = pGVar13->XAdvance;
    }
    this->FallbackXAdvance = fVar16;
    for (iVar15 = 0; uVar14 + 1 != iVar15; iVar15 = iVar15 + 1) {
      pvVar11 = ImVector<float>::operator[](this_01,iVar15);
      if (*pvVar11 <= 0.0 && *pvVar11 != 0.0) {
        vVar1 = this->FallbackXAdvance;
        pvVar11 = ImVector<float>::operator[](this_01,iVar15);
        *pvVar11 = vVar1;
      }
    }
    return;
  }
  __assert_fail("Glyphs.Size < 0xFFFF",
                "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui_draw.cpp"
                ,0x6af,"void ImFont::BuildLookupTable()");
}

Assistant:

void ImFont::BuildLookupTable()
{
    int max_codepoint = 0;
    for (int i = 0; i != Glyphs.Size; i++)
        max_codepoint = ImMax(max_codepoint, (int)Glyphs[i].Codepoint);

    IM_ASSERT(Glyphs.Size < 0xFFFF); // -1 is reserved
    IndexXAdvance.clear();
    IndexLookup.clear();
    GrowIndex(max_codepoint + 1);
    for (int i = 0; i < Glyphs.Size; i++)
    {
        int codepoint = (int)Glyphs[i].Codepoint;
        IndexXAdvance[codepoint] = Glyphs[i].XAdvance;
        IndexLookup[codepoint] = (unsigned short)i;
    }

    // Create a glyph to handle TAB
    // FIXME: Needs proper TAB handling but it needs to be contextualized (or we could arbitrary say that each string starts at "column 0" ?)
    if (FindGlyph((unsigned short)' '))
    {
        if (Glyphs.back().Codepoint != '\t')   // So we can call this function multiple times
            Glyphs.resize(Glyphs.Size + 1);
        ImFont::Glyph& tab_glyph = Glyphs.back();
        tab_glyph = *FindGlyph((unsigned short)' ');
        tab_glyph.Codepoint = '\t';
        tab_glyph.XAdvance *= 4;
        IndexXAdvance[(int)tab_glyph.Codepoint] = (float)tab_glyph.XAdvance;
        IndexLookup[(int)tab_glyph.Codepoint] = (unsigned short)(Glyphs.Size-1);
    }

    FallbackGlyph = NULL;
    FallbackGlyph = FindGlyph(FallbackChar);
    FallbackXAdvance = FallbackGlyph ? FallbackGlyph->XAdvance : 0.0f;
    for (int i = 0; i < max_codepoint + 1; i++)
        if (IndexXAdvance[i] < 0.0f)
            IndexXAdvance[i] = FallbackXAdvance;
}